

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef fold_simplify_intsub_k64(jit_State *J)

{
  long lVar1;
  TRef TVar2;
  uint uVar3;
  cTValue *tv;
  
  lVar1 = *(long *)(ulong)(J->fold).right.field_1.op12;
  if (lVar1 == 0) {
    uVar3 = (uint)(J->fold).ins.field_0.op1;
  }
  else {
    (J->fold).ins.field_1.o = '(';
    tv = lj_ir_k64_find(J,-lVar1);
    TVar2 = lj_ir_k64(J,IR_KINT64,tv);
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

LJFOLD(SUB any KINT64)
LJFOLDF(simplify_intsub_k64)
{
  uint64_t k = ir_kint64(fright)->u64;
  if (k == 0)  /* i - 0 ==> i */
    return LEFTFOLD;
  fins->o = IR_ADD;  /* i - k ==> i + (-k) */
  fins->op2 = (IRRef1)lj_ir_kint64(J, (uint64_t)-(int64_t)k);
  return RETRYFOLD;
}